

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O0

ze_result_t zeGetModuleProcAddrTable(ze_api_version_t version,ze_module_dditable_t *pDdiTable)

{
  ze_result_t result;
  ze_module_dditable_t *dditable;
  ze_module_dditable_t *pDdiTable_local;
  ze_api_version_t version_local;
  
  if (pDdiTable == (ze_module_dditable_t *)0x0) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (((int)tracing_layer::context >> 0x10 == (int)version >> 0x10) &&
          ((tracing_layer::context & 0xffff) <= (version & 0xffff))) {
    DAT_002da738 = pDdiTable->pfnCreate;
    pDdiTable->pfnCreate = tracing_layer::zeModuleCreate;
    DAT_002da740 = pDdiTable->pfnDestroy;
    pDdiTable->pfnDestroy = tracing_layer::zeModuleDestroy;
    DAT_002da748 = pDdiTable->pfnDynamicLink;
    pDdiTable->pfnDynamicLink = tracing_layer::zeModuleDynamicLink;
    DAT_002da750 = pDdiTable->pfnGetNativeBinary;
    pDdiTable->pfnGetNativeBinary = tracing_layer::zeModuleGetNativeBinary;
    DAT_002da758 = pDdiTable->pfnGetGlobalPointer;
    pDdiTable->pfnGetGlobalPointer = tracing_layer::zeModuleGetGlobalPointer;
    DAT_002da760 = pDdiTable->pfnGetKernelNames;
    pDdiTable->pfnGetKernelNames = tracing_layer::zeModuleGetKernelNames;
    DAT_002da768 = pDdiTable->pfnGetProperties;
    pDdiTable->pfnGetProperties = tracing_layer::zeModuleGetProperties;
    DAT_002da770 = pDdiTable->pfnGetFunctionPointer;
    pDdiTable->pfnGetFunctionPointer = tracing_layer::zeModuleGetFunctionPointer;
    _DAT_002da778 = pDdiTable->pfnInspectLinkageExt;
    pDdiTable->pfnInspectLinkageExt = tracing_layer::zeModuleInspectLinkageExt;
    pDdiTable_local._4_4_ = ZE_RESULT_SUCCESS;
  }
  else {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
  }
  return pDdiTable_local._4_4_;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetModuleProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_module_dditable_t* pDdiTable                 ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = tracing_layer::context.zeDdiTable.Module;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(tracing_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(tracing_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnCreate                                   = pDdiTable->pfnCreate;
    pDdiTable->pfnCreate                                 = tracing_layer::zeModuleCreate;

    dditable.pfnDestroy                                  = pDdiTable->pfnDestroy;
    pDdiTable->pfnDestroy                                = tracing_layer::zeModuleDestroy;

    dditable.pfnDynamicLink                              = pDdiTable->pfnDynamicLink;
    pDdiTable->pfnDynamicLink                            = tracing_layer::zeModuleDynamicLink;

    dditable.pfnGetNativeBinary                          = pDdiTable->pfnGetNativeBinary;
    pDdiTable->pfnGetNativeBinary                        = tracing_layer::zeModuleGetNativeBinary;

    dditable.pfnGetGlobalPointer                         = pDdiTable->pfnGetGlobalPointer;
    pDdiTable->pfnGetGlobalPointer                       = tracing_layer::zeModuleGetGlobalPointer;

    dditable.pfnGetKernelNames                           = pDdiTable->pfnGetKernelNames;
    pDdiTable->pfnGetKernelNames                         = tracing_layer::zeModuleGetKernelNames;

    dditable.pfnGetProperties                            = pDdiTable->pfnGetProperties;
    pDdiTable->pfnGetProperties                          = tracing_layer::zeModuleGetProperties;

    dditable.pfnGetFunctionPointer                       = pDdiTable->pfnGetFunctionPointer;
    pDdiTable->pfnGetFunctionPointer                     = tracing_layer::zeModuleGetFunctionPointer;

    dditable.pfnInspectLinkageExt                        = pDdiTable->pfnInspectLinkageExt;
    pDdiTable->pfnInspectLinkageExt                      = tracing_layer::zeModuleInspectLinkageExt;

    return result;
}